

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O2

vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
* __thiscall
LineFiller::fill_all_paths
          (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           *__return_storage_ptr__,LineFiller *this,
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          *lines)

{
  LineFiller *this_00;
  pointer pvVar1;
  ostream *poVar2;
  ulong uVar3;
  long lVar4;
  _Vector_base<long,_std::allocator<long>_> local_78;
  value_type line;
  _Vector_base<long,_std::allocator<long>_> local_48;
  
  this_00 = this + 0x10;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)this_00,
           ((long)(lines->
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(lines->
                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pvVar1 = (lines->
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(lines->
                       super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar3)
    break;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)
               &line.super__Vector_base<long,_std::allocator<long>_>,
               (vector<long,_std::allocator<long>_> *)
               ((long)&(pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data + lVar4));
    poVar2 = std::operator<<((ostream *)&std::cout,"Processing line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar3);
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_78,
               (vector<long,_std::allocator<long>_> *)
               &line.super__Vector_base<long,_std::allocator<long>_>);
    line_fill((vector<long,_std::allocator<long>_> *)&local_48,this,
              (vector<long,_std::allocator<long>_> *)&local_78);
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              ((vector<long,_std::allocator<long>_> *)(*(long *)this_00 + lVar4),&local_48);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_48);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_78);
    uVar3 = uVar3 + 1;
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&line.super__Vector_base<long,_std::allocator<long>_>);
    lVar4 = lVar4 + 0x18;
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::vector(__return_storage_ptr__,
           (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<sgNodeID_t >> LineFiller::fill_all_paths(std::vector<std::vector<sgNodeID_t >> lines){

    final_lines.resize(lines.size());
    auto total_ready = 0;
#pragma omp parallel for
    for (auto l=0; l<lines.size(); ++l){
        auto line = lines[l];
        std::cout << "Processing line " << total_ready << "/" << lines.size() <<std::endl;
        final_lines[l] = line_fill(line);
        total_ready++;
    }
    return final_lines;
}